

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

FIOBJ http_req2str(http_s *h)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  FIOBJ dest;
  FIOBJ FVar4;
  fiobj_object_vtable_s *pfVar5;
  char cVar6;
  char *data;
  fio_str_info_s t;
  header_writer_s w;
  fio_str_info_s local_48;
  FIOBJ local_30 [3];
  
  if ((h == (http_s *)0x0) ||
     ((((h->method == 0 && (h->status_str == 0)) && (h->status != 0)) ||
      (sVar3 = fiobj_hash_count(h->headers), sVar3 == 0)))) {
    return 0;
  }
  dest = fiobj_str_buf(0);
  local_30[0] = dest;
  if (h->status_str == 0) {
    fiobj_str_concat(dest,h->method);
    fiobj_str_write(dest," ",1);
    fiobj_str_concat(dest,h->path);
    if (h->query != 0) {
      fiobj_str_write(dest,"?",1);
      fiobj_str_concat(dest,h->query);
    }
    uVar1 = h->version;
    if (uVar1 == 0) {
LAB_0014d5c4:
      local_48.data = anon_var_dwarf_20c;
      local_48.len._0_4_ = 4;
      goto LAB_0014d5d7;
    }
    cVar6 = (char)uVar1;
    if ((uVar1 & 1) == 0) {
      switch((uint)uVar1 & 6) {
      case 0:
        cVar6 = *(char *)(uVar1 & 0xfffffffffffffff8);
LAB_0014d547:
        switch(cVar6) {
        case '\'':
          pfVar5 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case '(':
          goto switchD_0014d53c_caseD_2;
        case ')':
          pfVar5 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case '*':
          goto switchD_0014d53c_caseD_4;
        case '+':
          pfVar5 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar5 = &FIOBJECT_VTABLE_NUMBER;
        }
        break;
      case 2:
switchD_0014d53c_caseD_2:
        pfVar5 = &FIOBJECT_VTABLE_STRING;
        break;
      case 4:
switchD_0014d53c_caseD_4:
        pfVar5 = &FIOBJECT_VTABLE_HASH;
        break;
      case 6:
        if (cVar6 == '&') {
          local_48.data = anon_var_dwarf_217;
          local_48.len._0_4_ = 5;
        }
        else {
          uVar2 = (uint)uVar1 & 0xff;
          if (uVar2 != 0x16) {
            if (uVar2 == 6) goto LAB_0014d5c4;
            goto LAB_0014d547;
          }
          local_48.data = anon_var_dwarf_222;
          local_48.len._0_4_ = 4;
        }
LAB_0014d5d7:
        local_48.capa._0_4_ = 0;
        local_48.capa._4_4_ = 0;
        local_48.len._4_4_ = 0;
        goto LAB_0014d5db;
      }
      (*pfVar5->to_str)(&local_48,uVar1);
    }
    else {
      fio_ltocstr(&local_48,(long)uVar1 >> 1);
    }
LAB_0014d5db:
    if ((5 < CONCAT44(local_48.len._4_4_,(undefined4)local_48.len)) && (local_48.data[5] == '1')) {
      fiobj_str_write(dest," ",1);
      FVar4 = h->version;
      goto LAB_0014d4aa;
    }
    data = " HTTP/1.1\r\n";
    sVar3 = 10;
  }
  else {
    fiobj_str_concat(dest,h->version);
    fiobj_str_write(dest," ",1);
    FVar4 = fiobj_num_tmp(h->status);
    fiobj_str_concat(dest,FVar4);
    fiobj_str_write(dest," ",1);
    FVar4 = h->status_str;
LAB_0014d4aa:
    fiobj_str_concat(dest,FVar4);
    data = "\r\n";
    sVar3 = 2;
  }
  fiobj_str_write(dest,data,sVar3);
  uVar1 = h->headers;
  uVar2 = (uint)uVar1 & 6;
  if (((uVar2 == 6) || (uVar1 == 0)) || ((uVar1 & 1) != 0)) goto LAB_0014d6f6;
  if ((uVar1 & 6) == 0) {
    switch(*(undefined1 *)(uVar1 & 0xfffffffffffffff8)) {
    case 0x27:
      pfVar5 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_0014d67d_caseD_28;
    case 0x29:
      pfVar5 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_0014d67d_caseD_2a;
    case 0x2b:
      pfVar5 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar5 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar2 == 2) {
switchD_0014d67d_caseD_28:
    pfVar5 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_0014d67d_caseD_2a:
    pfVar5 = &FIOBJECT_VTABLE_HASH;
  }
  if (pfVar5->each == (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)
  goto LAB_0014d6f6;
  if ((uVar1 & 6) == 0) {
    switch(*(undefined1 *)(uVar1 & 0xfffffffffffffff8)) {
    case 0x27:
      pfVar5 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      goto switchD_0014d6cd_caseD_28;
    case 0x29:
      pfVar5 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      goto switchD_0014d6cd_caseD_2a;
    case 0x2b:
      pfVar5 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar5 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar2 == 2) {
switchD_0014d6cd_caseD_28:
    pfVar5 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_0014d6cd_caseD_2a:
    pfVar5 = &FIOBJECT_VTABLE_HASH;
  }
  (*pfVar5->each)(uVar1,0,write_header,local_30);
  dest = local_30[0];
LAB_0014d6f6:
  fiobj_str_write(dest,"\r\n",2);
  if (h->body != 0) {
    fiobj_str_concat(local_30[0],h->body);
  }
  return local_30[0];
}

Assistant:

FIOBJ http_req2str(http_s *h) {
  if (HTTP_INVALID_HANDLE(h) || !fiobj_hash_count(h->headers))
    return FIOBJ_INVALID;

  struct header_writer_s w;
  w.dest = fiobj_str_buf(0);
  if (h->status_str) {
    fiobj_str_join(w.dest, h->version);
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, fiobj_num_tmp(h->status));
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, h->status_str);
    fiobj_str_write(w.dest, "\r\n", 2);
  } else {
    fiobj_str_join(w.dest, h->method);
    fiobj_str_write(w.dest, " ", 1);
    fiobj_str_join(w.dest, h->path);
    if (h->query) {
      fiobj_str_write(w.dest, "?", 1);
      fiobj_str_join(w.dest, h->query);
    }
    {
      fio_str_info_s t = fiobj_obj2cstr(h->version);
      if (t.len < 6 || t.data[5] != '1')
        fiobj_str_write(w.dest, " HTTP/1.1\r\n", 10);
      else {
        fiobj_str_write(w.dest, " ", 1);
        fiobj_str_join(w.dest, h->version);
        fiobj_str_write(w.dest, "\r\n", 2);
      }
    }
  }

  fiobj_each1(h->headers, 0, write_header, &w);
  fiobj_str_write(w.dest, "\r\n", 2);
  if (h->body) {
    // fiobj_data_seek(h->body, 0);
    // fio_str_info_s t = fiobj_data_read(h->body, 0);
    // fiobj_str_write(w.dest, t.data, t.len);
    fiobj_str_join(w.dest, h->body);
  }
  return w.dest;
}